

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

ForStreamable<nonstd::expected_lite::expected<void,_int>,_std::string> * __thiscall
lest::make_string<nonstd::expected_lite::expected<void,int>>
          (ForStreamable<nonstd::expected_lite::expected<void,_int>,_std::string>
           *__return_storage_ptr__,lest *this,expected<void,_int> *item)

{
  ostringstream local_190 [8];
  ostringstream os;
  expected<void,_int> *item_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  operator<<((ostream *)local_190,(expected<void,_int> *)this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

auto make_string( T const & item ) -> ForStreamable<T, std::string>
{
    std::ostringstream os; os << item; return os.str();
}